

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

void FACT_INTERNAL_UpdateCue(FACTCue *cue)

{
  uint8_t *puVar1;
  uint16_t nIndex;
  FACTAudioEngine *pEngine;
  FACTSoundInstance *pFVar2;
  FACTWave *pFVar3;
  undefined8 in_RAX;
  ulong uVar4;
  long lVar5;
  float next;
  float local_24;
  
  local_24 = (float)((ulong)in_RAX >> 0x20);
  if (((cue->data->flags & 4) == 0) && (((cue->field_7).sound)->flags == '\x03')) {
    pEngine = cue->parentBank->parentEngine;
    nIndex = ((cue->field_7).sound)->category;
    if ((pEngine->variables[(short)nIndex].accessibility & 4) == 0) {
      FACTAudioEngine_GetGlobalVariable(pEngine,nIndex,&local_24);
    }
    else {
      FACTCue_GetVariable(cue,nIndex,&local_24);
    }
    if ((local_24 != cue->interactive) || (NAN(local_24) || NAN(cue->interactive))) {
      cue->interactive = local_24;
      pFVar2 = cue->playingSound;
      if (pFVar2 != (FACTSoundInstance *)0x0) {
        pFVar2->parentCue->playingSound = (FACTSoundInstance *)0x0;
        if (pFVar2->sound->trackCount != '\0') {
          lVar5 = 0;
          uVar4 = 0;
          do {
            pFVar3 = *(FACTWave **)((long)&(pFVar2->tracks->activeWave).wave + lVar5);
            if (pFVar3 != (FACTWave *)0x0) {
              FACTWave_Destroy(pFVar3);
            }
            pFVar3 = *(FACTWave **)((long)&(pFVar2->tracks->upcomingWave).wave + lVar5);
            if (pFVar3 != (FACTWave *)0x0) {
              FACTWave_Destroy(pFVar3);
            }
            (*cue->parentBank->parentEngine->pFree)
                      (*(void **)((long)&pFVar2->tracks->events + lVar5));
            uVar4 = uVar4 + 1;
            lVar5 = lVar5 + 0x68;
          } while (uVar4 < pFVar2->sound->trackCount);
        }
        (*cue->parentBank->parentEngine->pFree)(pFVar2->tracks);
        uVar4 = (ulong)pFVar2->sound->category;
        if (uVar4 != 0xffff) {
          puVar1 = &pFVar2->parentCue->parentBank->parentEngine->categories[uVar4].instanceCount;
          *puVar1 = *puVar1 + 0xff;
        }
      }
      FACT_INTERNAL_CreateSound(cue,0);
    }
  }
  return;
}

Assistant:

void FACT_INTERNAL_UpdateCue(FACTCue *cue)
{
	uint32_t i;
	float next;
	FACTSoundInstance *sound;

	/* Interactive sound selection */
	if (!(cue->data->flags & 0x04) && cue->variation->flags == 3)
	{
		/* Interactive */
		if (cue->parentBank->parentEngine->variables[cue->variation->variable].accessibility & 0x04)
		{
			FACTCue_GetVariable(
				cue,
				cue->variation->variable,
				&next
			);
		}
		else
		{
			FACTAudioEngine_GetGlobalVariable(
				cue->parentBank->parentEngine,
				cue->variation->variable,
				&next
			);
		}
		if (next != cue->interactive)
		{
			cue->interactive = next;

			/* New sound, time for death! */
			if (cue->playingSound != NULL)
			{
				/* Copy of DestroySound but does not set Cue to STOPPED */
				sound = cue->playingSound;
				sound->parentCue->playingSound = NULL;
				for (i = 0; i < sound->sound->trackCount; i += 1)
				{
					if (sound->tracks[i].activeWave.wave != NULL)
					{
						FACTWave_Destroy(
							sound->tracks[i].activeWave.wave
						);
					}
					if (sound->tracks[i].upcomingWave.wave != NULL)
					{
						FACTWave_Destroy(
							sound->tracks[i].upcomingWave.wave
						);
					}
					cue->parentBank->parentEngine->pFree(
						sound->tracks[i].events
					);
				}
				cue->parentBank->parentEngine->pFree(sound->tracks);

				if (sound->sound->category != FACTCATEGORY_INVALID)
				{
					sound->parentCue->parentBank->parentEngine->categories[
						sound->sound->category
					].instanceCount -= 1;
				}
			}

			/* TODO: Reset cue times? Transition tables...?
			cue->start = elapsed;
			cue->elapsed = 0;
			 */

			FACT_INTERNAL_CreateSound(cue, 0 /* fadeIn */);
		}
	}
}